

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSiteObject.h
# Opt level: O0

BOOL __thiscall
Js::CrossSiteObject<Js::JavascriptAsyncGenerator>::SetAccessors
          (CrossSiteObject<Js::JavascriptAsyncGenerator> *this,PropertyId propertyId,Var getter,
          Var setter,PropertyOperationFlags flags)

{
  BOOL BVar1;
  ScriptContext *pSVar2;
  Var pvStack_28;
  PropertyOperationFlags flags_local;
  Var setter_local;
  Var getter_local;
  PropertyId propertyId_local;
  CrossSiteObject<Js::JavascriptAsyncGenerator> *this_local;
  
  setter_local = getter;
  if (getter != (Var)0x0) {
    pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    setter_local = CrossSite::MarshalVar(pSVar2,getter,false);
  }
  pvStack_28 = setter;
  if (setter != (Var)0x0) {
    pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    pvStack_28 = CrossSite::MarshalVar(pSVar2,setter,false);
  }
  BVar1 = DynamicObject::SetAccessors
                    ((DynamicObject *)this,propertyId,setter_local,pvStack_28,flags);
  return BVar1;
}

Assistant:

BOOL CrossSiteObject<T>::SetAccessors(PropertyId propertyId, Var getter, Var setter, PropertyOperationFlags flags)
    {
        if (getter != nullptr)
        {
            getter = CrossSite::MarshalVar(this->GetScriptContext(), getter);
        }
        if (setter != nullptr)
        {
            setter = CrossSite::MarshalVar(this->GetScriptContext(), setter);
        }
        return __super::SetAccessors(propertyId, getter, setter, flags);
    }